

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O2

size_t magic_enum::containers::detail::popcount<unsigned_char>(uchar x)

{
  size_t c;
  
  c = 0;
  for (; x != 0; x = x >> 1) {
    c = c + (x & 1);
  }
  return c;
}

Assistant:

constexpr std::size_t popcount(T x) noexcept {
  std::size_t c = 0;
  while (x > 0) {
    c += x & 1;
    x >>= 1;
  }
  return c;
}